

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseCommand(Parser *this)

{
  Tokenizer *pTVar1;
  CAssemblerCommand *this_00;
  Architecture *pAVar2;
  Token *token;
  Parser *in_RSI;
  pointer __old_p;
  pointer pFVar3;
  pointer __old_p_3;
  pointer __old_p_1;
  pointer local_30;
  
  updateFileInfo(in_RSI);
  pTVar1 = (in_RSI->entries).
           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].tokenizer;
  if (*(Tokenizer **)&pTVar1->position == pTVar1) {
    this_00 = (CAssemblerCommand *)operator_new(0x18);
    this_00->_vptr_CAssemblerCommand = (_func_int **)0x0;
    this_00->FileNum = 0;
    this_00->FileLine = 0;
    *(undefined8 *)&this_00->section = 0;
    CAssemblerCommand::CAssemblerCommand(this_00);
    this_00->_vptr_CAssemblerCommand = (_func_int **)&PTR__CAssemblerCommand_001be968;
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
    return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
  }
  parseLabel((Parser *)&stack0xffffffffffffffd0);
  pFVar3 = local_30;
  if (local_30 == (pointer)0x0) {
    if (in_RSI->error == true) {
      handleError(this);
      return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
    }
    parseMacroCall((Parser *)&stack0xffffffffffffffd0);
    pFVar3 = local_30;
    local_30 = (pointer)0x0;
    if (pFVar3 == (pointer)0x0) {
      if (in_RSI->error == true) {
        handleError(this);
        return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
      }
      pAVar2 = Architecture::current();
      (**pAVar2->_vptr_Architecture)(&stack0xffffffffffffffd0,pAVar2);
      pFVar3 = local_30;
      local_30 = (pointer)0x0;
      if (pFVar3 != (pointer)0x0) goto LAB_00146c85;
      if (in_RSI->error == true) {
        handleError(this);
        return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
      }
      parseDirective((Parser *)&stack0xffffffffffffffd0,(DirectiveMap *)in_RSI);
      pFVar3 = local_30;
      local_30 = (pointer)0x0;
      if (pFVar3 != (pointer)0x0) {
        (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = pFVar3;
        return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
      }
      if (in_RSI->error == true) {
        handleError(this);
        return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
      }
      pAVar2 = Architecture::current();
      (*pAVar2->_vptr_Architecture[1])(&stack0xffffffffffffffd0);
      pFVar3 = local_30;
      local_30 = (pointer)0x0;
      if (pFVar3 == (pointer)0x0) {
        if (in_RSI->error == true) {
          handleError(this);
          return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
        }
        token = Tokenizer::peekToken
                          ((in_RSI->entries).
                           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
        printError<std::__cxx11::string>(in_RSI,token,"Parse error \'%s\'",&token->originalText);
        handleError(this);
        return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
      }
    }
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = pFVar3;
  }
  else {
LAB_00146c85:
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = pFVar3;
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseCommand()
{
	std::unique_ptr<CAssemblerCommand> command;

	updateFileInfo();

	if (atEnd())
		return std::make_unique<DummyCommand>();

	if ((command = parseLabel()) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = parseMacroCall()) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = Architecture::current().parseDirective(*this)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = parseDirective(directives)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	if ((command = Architecture::current().parseOpcode(*this)) != nullptr)
		return command;
	if (hasError())
		return handleError();

	const Token& token = peekToken();
	printError(token,"Parse error '%s'", token.getOriginalText());
	return handleError();
}